

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O0

bool __thiscall APowerup::DrawPowerup(APowerup *this,int x,int y)

{
  bool bVar1;
  FTexture *img;
  FTexture *pic;
  int y_local;
  int x_local;
  APowerup *this_local;
  
  bVar1 = FTextureID::isValid(&(this->super_AInventory).Icon);
  if (bVar1) {
    if ((0x80 < *(int *)&(this->super_AInventory).field_0x4dc) ||
       ((*(uint *)&(this->super_AInventory).field_0x4dc & 0x10) == 0)) {
      img = FTextureManager::operator()
                      (&TexMan,(FTextureID)(this->super_AInventory).Icon.texnum,false);
      DCanvas::DrawTexture((DCanvas *)screen,img,(double)x,(double)y,0x400013a6,0);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool APowerup::DrawPowerup (int x, int y)
{
	if (!Icon.isValid())
	{
		return false;
	}
	if (EffectTics > BLINKTHRESHOLD || !(EffectTics & 16))
	{
		FTexture *pic = TexMan(Icon);
		screen->DrawTexture (pic, x, y,
			DTA_HUDRules, HUD_Normal,
//			DTA_TopOffset, pic->GetHeight()/2,
//			DTA_LeftOffset, pic->GetWidth()/2,
			TAG_DONE);
	}
	return true;
}